

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_priority.cxx
# Opt level: O0

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_priority_change_req(raft_server *this,req_msg *req)

{
  bool bVar1;
  int iVar2;
  socklen_t sVar3;
  uint uVar4;
  size_type sVar5;
  element_type *peVar6;
  size_t sVar7;
  element_type *this_00;
  element_type *this_01;
  element_type *peVar8;
  socklen_t *__addr_len;
  req_msg *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  sockaddr *__addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  socklen_t *in_RSI;
  element_type *in_RDI;
  ptr<resp_msg> pVar10;
  srv_config *s_conf;
  shared_ptr<nuraft::srv_config> *entry;
  iterator __end1;
  iterator __begin1;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *__range1;
  ptr<cluster_config> c_conf;
  int32 t_priority;
  int32 t_id;
  buffer *buf;
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *v;
  ptr<resp_msg> *resp;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  int *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  buffer *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  string local_138 [32];
  string local_118 [32];
  element_type *local_f8;
  __shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *local_f0;
  _Self local_e8;
  _Self local_e0;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *local_d8;
  uint local_c0;
  socklen_t local_bc;
  string local_b8 [32];
  buffer *local_98;
  string local_90 [36];
  undefined4 local_6c;
  string local_68 [48];
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *local_38;
  int32 local_30;
  undefined4 local_2c;
  ulong local_28;
  byte local_19;
  req_msg *local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  local_28 = msg_base::get_term(&in_RDX->super_msg_base);
  local_2c = 0x19;
  local_30 = msg_base::get_src(&local_18->super_msg_base);
  cs_new<nuraft::resp_msg,unsigned_long,nuraft::msg_type,int&,int>
            ((unsigned_long *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
             (msg_type *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             in_stack_fffffffffffffe18,
             (int *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  local_38 = req_msg::log_entries(local_18);
  sVar5 = std::
          vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
          ::size(local_38);
  if (sVar5 == 0) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0xc6));
    _Var9._M_pi = extraout_RDX;
    if (bVar1) {
      peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1ef9f1);
      iVar2 = (*peVar6->_vptr_logger[7])();
      _Var9._M_pi = extraout_RDX_00;
      if (2 < iVar2) {
        peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1efa2a);
        msg_if_given_abi_cxx11_((char *)local_68,"no log entry");
        (*peVar6->_vptr_logger[8])
                  (peVar6,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                   ,"handle_priority_change_req",0xa2,local_68);
        std::__cxx11::string::~string(local_68);
        _Var9._M_pi = extraout_RDX_01;
      }
    }
    local_19 = 1;
    local_6c = 1;
  }
  else {
    std::
    vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
    ::operator[](local_38,0);
    std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1efafd);
    bVar1 = log_entry::is_buf_null((log_entry *)0x1efb05);
    if (bVar1) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0xc6));
      _Var9._M_pi = extraout_RDX_02;
      if (bVar1) {
        peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1efb4f);
        iVar2 = (*peVar6->_vptr_logger[7])();
        _Var9._M_pi = extraout_RDX_03;
        if (2 < iVar2) {
          peVar6 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1efb88);
          msg_if_given_abi_cxx11_((char *)local_90,"empty buffer");
          (*peVar6->_vptr_logger[8])
                    (peVar6,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                     ,"handle_priority_change_req",0xa6,local_90);
          std::__cxx11::string::~string(local_90);
          _Var9._M_pi = extraout_RDX_04;
        }
      }
      local_19 = 1;
      local_6c = 1;
    }
    else {
      std::
      vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
      ::operator[](local_38,0);
      std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1efc3c);
      local_98 = log_entry::get_buf((log_entry *)
                                    CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      nuraft::buffer::pos(in_stack_fffffffffffffe30,
                          CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      sVar7 = nuraft::buffer::size(local_98);
      if (sVar7 < 8) {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0xc6));
        _Var9._M_pi = extraout_RDX_05;
        if (bVar1) {
          peVar6 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1efcbf);
          iVar2 = (*peVar6->_vptr_logger[7])();
          _Var9._M_pi = extraout_RDX_06;
          if (2 < iVar2) {
            peVar6 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1efcf2);
            sVar7 = nuraft::buffer::size(local_98);
            msg_if_given_abi_cxx11_((char *)local_b8,"wrong buffer size: %zu",sVar7);
            (*peVar6->_vptr_logger[8])
                      (peVar6,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                       ,"handle_priority_change_req",0xad,local_b8);
            std::__cxx11::string::~string(local_b8);
            _Var9._M_pi = extraout_RDX_07;
          }
        }
        local_19 = 1;
        local_6c = 1;
      }
      else {
        local_bc = nuraft::buffer::get_int
                             ((buffer *)
                              CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
        local_c0 = nuraft::buffer::get_int((buffer *)CONCAT44(local_bc,in_stack_fffffffffffffe50));
        __addr_len = in_RSI;
        if (local_bc == in_RSI[0xe]) {
          __addr_len = (socklen_t *)(ulong)local_c0;
          in_RSI[0xf] = local_c0;
        }
        get_config((raft_server *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        this_00 = std::
                  __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1efe2c);
        local_d8 = cluster_config::get_servers_abi_cxx11_(this_00);
        local_e0._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
             ::begin(in_stack_fffffffffffffe08);
        local_e8._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
             ::end(in_stack_fffffffffffffe08);
        while (bVar1 = std::operator!=(&local_e0,&local_e8), bVar1) {
          local_f0 = &std::_List_iterator<std::shared_ptr<nuraft::srv_config>_>::operator*
                                ((_List_iterator<std::shared_ptr<nuraft::srv_config>_> *)
                                 CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10))->
                      super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>;
          local_f8 = std::__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>::get
                               (local_f0);
          sVar3 = srv_config::get_id(local_f8);
          if (sVar3 == local_bc) {
            this_01 = std::
                      __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1efeeb);
            peVar8 = std::
                     __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1eff04);
            iVar2 = (*peVar8->_vptr_log_store[2])();
            resp_msg::accept(this_01,iVar2,__addr,__addr_len);
            bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0xc6));
            if (bVar1) {
              peVar6 = std::
                       __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x1eff59);
              iVar2 = (*peVar6->_vptr_logger[7])();
              if (3 < iVar2) {
                peVar6 = std::
                         __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x1eff8c);
                sVar3 = local_bc;
                uVar4 = srv_config::get_priority(local_f8);
                msg_if_given_abi_cxx11_
                          ((char *)local_118,"change peer %d priority: %d -> %d",(ulong)sVar3,
                           (ulong)uVar4,(ulong)local_c0);
                (*peVar6->_vptr_logger[8])
                          (peVar6,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                           ,"handle_priority_change_req",0xbe,local_118);
                std::__cxx11::string::~string(local_118);
              }
            }
            srv_config::set_priority(local_f8,local_c0);
            goto LAB_001f0194;
          }
          std::_List_iterator<std::shared_ptr<nuraft::srv_config>_>::operator++(&local_e0);
        }
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0xc6));
        if (bVar1) {
          peVar6 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1f00c9);
          iVar2 = (*peVar6->_vptr_logger[7])();
          if (2 < iVar2) {
            peVar6 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1f00fc);
            msg_if_given_abi_cxx11_((char *)local_138,"cannot find peer %d",(ulong)local_bc);
            (*peVar6->_vptr_logger[8])
                      (peVar6,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                       ,"handle_priority_change_req",0xc3,local_138);
            std::__cxx11::string::~string(local_138);
          }
        }
LAB_001f0194:
        local_19 = 1;
        local_6c = 1;
        std::shared_ptr<nuraft::cluster_config>::~shared_ptr
                  ((shared_ptr<nuraft::cluster_config> *)0x1f01a1);
        _Var9._M_pi = extraout_RDX_08;
      }
    }
  }
  if ((local_19 & 1) == 0) {
    std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x1f01c9);
    _Var9._M_pi = extraout_RDX_09;
  }
  pVar10.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var9._M_pi;
  pVar10.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<resp_msg>)pVar10.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_priority_change_req(req_msg& req) {
    // NOTE: now this function is protected by lock.
    ptr<resp_msg> resp
        ( cs_new<resp_msg>
          ( req.get_term(),
            msg_type::priority_change_response,
            id_,
            req.get_src() ) );

    std::vector< ptr<log_entry> >& v = req.log_entries();
    if (!v.size()) {
        p_wn("no log entry");
        return resp;
    }
    if (v[0]->is_buf_null()) {
        p_wn("empty buffer");
        return resp;
    }

    buffer& buf = v[0]->get_buf();
    buf.pos(0);
    if (buf.size() < sz_int * 2) {
        p_wn("wrong buffer size: %zu", buf.size());
        return resp;
    }

    int32 t_id = buf.get_int();
    int32 t_priority = buf.get_int();

    if (t_id == id_) {
        my_priority_ = t_priority;
    }

    ptr<cluster_config> c_conf = get_config();
    for (auto& entry: c_conf->get_servers()) {
        srv_config* s_conf = entry.get();
        if ( s_conf->get_id() == t_id ) {
            resp->accept(log_store_->next_slot());
            p_in("change peer %d priority: %d -> %d",
                 t_id, s_conf->get_priority(), t_priority);
            s_conf->set_priority(t_priority);
            return resp;
        }
    }
    p_wn("cannot find peer %d", t_id);

    return resp;
}